

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d57_q2_heap_order2.cpp
# Opt level: O2

bool __thiscall student::operator<(student *this,student *rhs)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = sum_score(this);
  iVar3 = sum_score(rhs);
  if (iVar2 == iVar3) {
    bVar1 = std::operator>(&this->name,&rhs->name);
    return bVar1;
  }
  return iVar2 < iVar3;
}

Assistant:

bool operator<(const student &rhs) const {
    int ls = sum_score();
    int rs = rhs.sum_score();
    return ls != rs ? ls < rs : name > rhs.name;
  }